

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatInt
          (LocalizedNumberFormatter *this,int64_t value,UErrorCode *status)

{
  UNumberCompactStyle UVar1;
  UFormattedNumberData *results;
  UNumberCompactStyle *in_RCX;
  UErrorCode *pUVar2;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *extraout_RDX_01;
  UErrorCode *extraout_RDX_02;
  UFormattedNumberData *p;
  FormattedNumber FVar3;
  
  if ((int)*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
    results = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,value);
    if (results == (UFormattedNumberData *)0x0) {
      results = (UFormattedNumberData *)0x0;
      pUVar2 = extraout_RDX;
    }
    else {
      memset(results,0,0x158);
      results->fMagic = 0x46444e00;
      impl::DecimalQuantity::DecimalQuantity(&results->quantity);
      impl::NumberStringBuilder::NumberStringBuilder(&results->string);
      pUVar2 = extraout_RDX_00;
    }
    if (results == (UFormattedNumberData *)0x0) {
      *in_RCX = 7;
      UVar1 = 7;
    }
    else {
      impl::DecimalQuantity::setToLong(&results->quantity,(int64_t)status);
      p = results;
      formatImpl((LocalizedNumberFormatter *)value,results,(UErrorCode *)in_RCX);
      if ((int)*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
        UVar1 = UNUM_SHORT;
        pUVar2 = extraout_RDX_01;
        goto LAB_00267215;
      }
      impl::NumberStringBuilder::~NumberStringBuilder(&results->string);
      impl::DecimalQuantity::~DecimalQuantity(&results->quantity);
      UMemory::operator_delete((UMemory *)results,p);
      UVar1 = *in_RCX;
      pUVar2 = extraout_RDX_02;
    }
  }
  else {
    UVar1 = UNUM_LONG;
    pUVar2 = status;
  }
  results = (UFormattedNumberData *)0x0;
LAB_00267215:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       results;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.compactStyle = UVar1;
  FVar3._8_8_ = pUVar2;
  FVar3.fResults = (UFormattedNumberData *)this;
  return FVar3;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatInt(int64_t value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToLong(value);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}